

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O2

JavascriptString * __thiscall Js::ScriptFunction::GetDisplayNameImpl(ScriptFunction *this)

{
  ushort uVar1;
  code *pcVar2;
  charcount_t cVar3;
  bool bVar4;
  int iVar5;
  FunctionProxy *pFVar6;
  undefined4 *puVar7;
  ParseableFunctionInfo *this_00;
  undefined4 extraout_var;
  char16 *name;
  undefined4 extraout_var_00;
  JavascriptString *pJVar8;
  char16 *local_38;
  char16 *symbolName;
  JavascriptString *computedName;
  charcount_t symbolNameLength;
  charcount_t length;
  Var computedNameVar;
  
  pFVar6 = GetFunctionProxy(this);
  if (pFVar6 == (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x324,"(this->GetFunctionProxy() != nullptr)",
                                "this->GetFunctionProxy() != nullptr");
    if (!bVar4) goto LAB_00be91da;
    *puVar7 = 0;
  }
  pFVar6 = GetFunctionProxy(this);
  this_00 = FunctionProxy::EnsureDeserialized(pFVar6);
  computedName._4_4_ = 0;
  EnterPinnedScope(&symbolName);
  iVar5 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x76])(this);
  computedNameVar = (Var)CONCAT44(extraout_var,iVar5);
  if (computedNameVar == (Var)0x0) {
    uVar1 = *(ushort *)&(this_00->super_FunctionProxy).field_0x45;
    if (((uVar1 & 0x20) != 0) ||
       ((name = L"", (uVar1 & 0x40) != 0 &&
        ((((((((((((this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
                   super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->
            m_ES6FunctionNameFull == true || ((uVar1 & 0xc) != 0)) ||
          (bVar4 = FunctionProxy::IsLambda(&this_00->super_FunctionProxy), bVar4)) ||
         (iVar5 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x73])(this), CONCAT44(extraout_var_00,iVar5) != 0)
         ))))) {
      name = FunctionProxy::GetShortDisplayName
                       (&this_00->super_FunctionProxy,(charcount_t *)((long)&computedName + 4));
    }
  }
  else {
    local_38 = (char16 *)0x0;
    computedName._0_4_ = 0;
    bVar4 = GetSymbolName(computedNameVar,&local_38,(charcount_t *)&computedName);
    cVar3 = (charcount_t)computedName;
    if (bVar4) {
      name = local_38;
      if ((charcount_t)computedName != 0) {
        name = FunctionProxy::WrapWithBrackets
                         (local_38,(charcount_t)computedName,
                          (((((this->super_ScriptFunctionBase).super_JavascriptFunction.
                              super_DynamicObject.super_RecyclableObject.type.ptr)->
                            javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
        ;
        computedName._4_4_ = cVar3 + 2;
      }
    }
    else {
      symbolName = (char16 *)
                   GetComputedName(computedNameVar,
                                   (((((this->super_ScriptFunctionBase).super_JavascriptFunction.
                                       super_DynamicObject.super_RecyclableObject.type.ptr)->
                                     javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                                   scriptContext.ptr);
      if (((this_00->super_FunctionProxy).field_0x45 & 8) == 0) {
        return (JavascriptString *)symbolName;
      }
      name = JavascriptString::GetString((JavascriptString *)symbolName);
      computedName._4_4_ = JavascriptString::GetLength((JavascriptString *)symbolName);
    }
  }
  bVar4 = IsValidCharCount((ulong)computedName._4_4_);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x35c,"(IsValidCharCount(length))",
                                "JavascriptString can\'t be larger than charcount_t");
    if (!bVar4) {
LAB_00be91da:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  pJVar8 = JavascriptFunction::DisplayNameHelper((JavascriptFunction *)this,name,computedName._4_4_)
  ;
  LeavePinnedScope();
  return pJVar8;
}

Assistant:

JavascriptString* ScriptFunction::GetDisplayNameImpl() const
    {
        Assert(this->GetFunctionProxy() != nullptr); // The caller should guarantee a proxy exists
        ParseableFunctionInfo * func = this->GetFunctionProxy()->EnsureDeserialized();
        const char16* name = nullptr;
        charcount_t length = 0;
        JavascriptString* returnStr = nullptr;
        ENTER_PINNED_SCOPE(JavascriptString, computedName);
        Var computedNameVar = this->GetComputedNameVar();
        if (computedNameVar != nullptr)
        {
            const char16* symbolName = nullptr;
            charcount_t symbolNameLength = 0;
            if (ScriptFunction::GetSymbolName(computedNameVar, &symbolName, &symbolNameLength))
            {
                if (symbolNameLength == 0)
                {
                    name = symbolName;
                }
                else
                {
                    name = FunctionProxy::WrapWithBrackets(symbolName, symbolNameLength, this->GetScriptContext());
                    length = symbolNameLength + 2; //adding 2 to length for  brackets
                }
            }
            else
            {
                computedName = ScriptFunction::GetComputedName(computedNameVar, this->GetScriptContext());
                if (!func->GetIsAccessor())
                {
                    return computedName;
                }
                name = computedName->GetString();
                length = computedName->GetLength();
            }
        }
        else
        {
            name = Constants::Empty;
            if (func->GetIsNamedFunctionExpression()) // GetIsNamedFunctionExpression -> ex. var a = function foo() {} where name is foo
            {
                name = func->GetShortDisplayName(&length);
            }
            else if (func->GetIsNameIdentifierRef()) // GetIsNameIdentifierRef        -> confirms a name is not attached like o.x = function() {}
            {
                if (this->GetScriptContext()->GetConfig()->IsES6FunctionNameFullEnabled())
                {
                    name = func->GetShortDisplayName(&length);
                }
                else if (func->GetIsDeclaration() || // GetIsDeclaration -> ex. function foo () {}
                         func->GetIsAccessor()    || // GetIsAccessor    -> ex. var a = { get f() {}} new enough syntax that we do not have to disable by default
                         func->IsLambda()         || // IsLambda         -> ex. var y = { o : () => {}}
                         GetHomeObj())               // GetHomeObj       -> ex. var o = class {}, confirms this is a constructor or method on a class
                {
                    name = func->GetShortDisplayName(&length);
                }
            }
        }
        AssertMsg(IsValidCharCount(length), "JavascriptString can't be larger than charcount_t");
        returnStr = DisplayNameHelper(name, static_cast<charcount_t>(length));

        LEAVE_PINNED_SCOPE();

        return returnStr;
    }